

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QTextBlock>::insert
          (QMovableArrayOps<QTextBlock> *this,qsizetype i,qsizetype n,parameter_type t)

{
  int iVar1;
  QTextDocumentPrivate *pQVar2;
  long lVar3;
  QTextBlock *pQVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_60;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = t->p;
  iVar1 = t->n;
  bVar6 = (this->super_QGenericArrayOps<QTextBlock>).super_QArrayDataPointer<QTextBlock>.size != 0;
  QArrayDataPointer<QTextBlock>::detachAndGrow
            ((QArrayDataPointer<QTextBlock> *)this,(uint)(i == 0 && bVar6),n,(QTextBlock **)0x0,
             (QArrayDataPointer<QTextBlock> *)0x0);
  if (i == 0 && bVar6) {
    if (n != 0) {
      pQVar4 = (this->super_QGenericArrayOps<QTextBlock>).super_QArrayDataPointer<QTextBlock>.ptr;
      lVar3 = (this->super_QGenericArrayOps<QTextBlock>).super_QArrayDataPointer<QTextBlock>.size;
      qVar5 = n;
      do {
        pQVar4[-1].p = pQVar2;
        pQVar4[-1].n = iVar1;
        pQVar4 = pQVar4 + -1;
        qVar5 = qVar5 + -1;
      } while (qVar5 != 0);
      (this->super_QGenericArrayOps<QTextBlock>).super_QArrayDataPointer<QTextBlock>.ptr = pQVar4;
      (this->super_QGenericArrayOps<QTextBlock>).super_QArrayDataPointer<QTextBlock>.size =
           lVar3 + n;
    }
  }
  else {
    local_60.displaceFrom =
         (this->super_QGenericArrayOps<QTextBlock>).super_QArrayDataPointer<QTextBlock>.ptr + i;
    local_60.displaceTo = local_60.displaceFrom + n;
    local_60.bytes =
         ((this->super_QGenericArrayOps<QTextBlock>).super_QArrayDataPointer<QTextBlock>.size - i) *
         0x10;
    local_60.data = (QArrayDataPointer<QTextBlock> *)this;
    local_60.nInserts = n;
    memmove(local_60.displaceTo,local_60.displaceFrom,local_60.bytes);
    if (n != 0) {
      do {
        (local_60.displaceFrom)->p = pQVar2;
        (local_60.displaceFrom)->n = iVar1;
        local_60.displaceFrom = local_60.displaceFrom + 1;
        n = n + -1;
      } while (n != 0);
    }
    Inserter::~Inserter(&local_60);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }